

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_KillMaster
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int flags;
  int iVar1;
  int selector;
  AActor *origin;
  PClassActor *filter;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  VMValue *pVVar5;
  VMValue *pVVar6;
  AActor *source;
  AActor *inflictor;
  char *pcVar7;
  AActor *pAVar8;
  bool bVar9;
  FName local_38;
  FName local_34;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      origin = (AActor *)(param->field_0).field_1.a;
      if (origin != (AActor *)0x0) {
        if ((origin->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
          (origin->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar4 = (origin->super_DThinker).super_DObject.Class;
        bVar9 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar9) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar9 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar9) {
          pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003df112;
        }
      }
      if (numparam == 1) {
        pVVar6 = defaultparam->Array;
        if (defaultparam->Array[1].field_0.field_3.Type != '\0') {
          pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003df131:
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x17c5,
                        "int AF_AActor_A_KillMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      else {
        pVVar6 = param;
        if (param[1].field_0.field_3.Type != '\0') {
          pcVar7 = "(param[paramnum]).Type == REGT_INT";
          goto LAB_003df131;
        }
      }
      iVar3 = pVVar6[1].field_0.i;
      if (numparam < 3) {
        pVVar6 = defaultparam->Array;
        if (pVVar6[2].field_0.field_3.Type != '\0') {
          pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
          goto LAB_003df150;
        }
      }
      else {
        pVVar6 = param;
        if (param[2].field_0.field_3.Type != '\0') {
          pcVar7 = "(param[paramnum]).Type == REGT_INT";
LAB_003df150:
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x17c6,
                        "int AF_AActor_A_KillMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      flags = pVVar6[2].field_0.i;
      if (numparam < 4) {
        pVVar6 = defaultparam->Array;
        if ((pVVar6[3].field_0.field_3.Type != '\x03') ||
           ((pVVar5 = pVVar6 + 3, pVVar6[3].field_0.field_1.atag != 1 &&
            ((pVVar5->field_0).field_1.a != (void *)0x0)))) {
          pcVar7 = 
          "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
          ;
          goto LAB_003df0f3;
        }
      }
      else if ((param[3].field_0.field_3.Type != '\x03') ||
              ((pVVar5 = param + 3, param[3].field_0.field_1.atag != 1 &&
               ((pVVar5->field_0).field_1.a != (void *)0x0)))) {
        pcVar7 = 
        "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
        ;
LAB_003df0f3:
        __assert_fail(pcVar7,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x17c7,
                      "int AF_AActor_A_KillMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      filter = (PClassActor *)(pVVar5->field_0).field_1.a;
      if (numparam < 5) {
        pVVar6 = defaultparam->Array;
        if (pVVar6[4].field_0.field_3.Type != '\0') {
          pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
          goto LAB_003df16f;
        }
      }
      else {
        pVVar6 = param;
        if (param[4].field_0.field_3.Type != '\0') {
          pcVar7 = "(param[paramnum]).Type == REGT_INT";
LAB_003df16f:
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x17c8,
                        "int AF_AActor_A_KillMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      iVar1 = pVVar6[4].field_0.i;
      if (numparam < 6) {
        pVVar6 = defaultparam->Array;
        if (pVVar6[5].field_0.field_3.Type != '\0') {
          pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
          goto LAB_003df18e;
        }
      }
      else {
        pVVar6 = param;
        if (param[5].field_0.field_3.Type != '\0') {
          pcVar7 = "(param[paramnum]).Type == REGT_INT";
LAB_003df18e:
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x17c9,
                        "int AF_AActor_A_KillMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      if (numparam < 7) {
        param = defaultparam->Array;
        if (param[6].field_0.field_3.Type == '\0') goto LAB_003df041;
        pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[6].field_0.field_3.Type == '\0') {
LAB_003df041:
          selector = param[6].field_0.i;
          source = COPY_AAPTR(origin,pVVar6[5].field_0.i);
          inflictor = COPY_AAPTR(origin,selector);
          pAVar8 = (origin->master).field_0.p;
          if (pAVar8 != (AActor *)0x0) {
            if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
              pAVar8 = (origin->master).field_0.p;
              if ((pAVar8 != (AActor *)0x0) &&
                 (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                (origin->master).field_0.p = (AActor *)0x0;
                pAVar8 = (AActor *)0x0;
              }
              local_38.Index = iVar1;
              local_34.Index = iVar3;
              DoKill(pAVar8,inflictor,source,&local_34,flags,filter,&local_38);
            }
            else {
              (origin->master).field_0.p = (AActor *)0x0;
            }
          }
          return 0;
        }
        pcVar7 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x17ca,
                    "int AF_AActor_A_KillMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003df112:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x17c4,
                "int AF_AActor_A_KillMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_KillMaster)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_NAME_DEF	(damagetype)	
	PARAM_INT_DEF	(flags)			
	PARAM_CLASS_DEF	(filter, AActor)
	PARAM_NAME_DEF	(species)		
	PARAM_INT_DEF	(src)			
	PARAM_INT_DEF	(inflict)		

	AActor *source = COPY_AAPTR(self, src); 
	AActor *inflictor = COPY_AAPTR(self, inflict);

	if (self->master != NULL)
		DoKill(self->master, inflictor, source, damagetype, flags, filter, species);
	return 0;
}